

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator::GenerateMergingCode
          (ImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  long lVar1;
  Descriptor *pDVar2;
  char *text;
  
  this_00 = this->descriptor_;
  if ((~(byte)this_00[1] & 0x60) != 0) {
    pDVar2 = FieldDescriptor::message_type(this_00);
    text = 
    "if (other.has$capitalized_name$()) {\n  set$capitalized_name$(other.get$capitalized_name$());\n}\n"
    ;
    if ((((pDVar2 != (Descriptor *)0x0) || (((byte)this_00[1] & 2) != 0)) ||
        (*(char *)(*(long *)(this_00 + 0x10) + 0x3a) == '\x02')) ||
       ((lVar1 = *(long *)(this_00 + 0x28), lVar1 != 0 && ((byte)this_00[1] & 0x10) != 0 &&
        ((*(int *)(lVar1 + 4) != 1 || ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) == 0))))))
    goto LAB_002fbe60;
  }
  text = 
  "if (other.get$capitalized_name$() != $default$) {\n  set$capitalized_name$(other.get$capitalized_name$());\n}\n"
  ;
LAB_002fbe60:
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutablePrimitiveFieldGenerator::GenerateMergingCode(
    io::Printer* printer) const {
  if (HasHazzer(descriptor_)) {
    printer->Print(variables_,
                   "if (other.has$capitalized_name$()) {\n"
                   "  set$capitalized_name$(other.get$capitalized_name$());\n"
                   "}\n");
  } else {
    printer->Print(variables_,
                   "if (other.get$capitalized_name$() != $default$) {\n"
                   "  set$capitalized_name$(other.get$capitalized_name$());\n"
                   "}\n");
  }
}